

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O3

void __thiscall adios2::format::BPBase::BPBase(BPBase *this,Comm *comm)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  
  this->_vptr_BPBase = (_func_int **)&PTR__BPBase_0086c328;
  this->m_Comm = comm;
  this->m_RankMPI = 0;
  this->m_SizeMPI = 1;
  this->m_Processes = 1;
  this->m_PreMetadataFileLength = 0;
  this->m_PreDataFileLength = 0;
  BufferSTL::BufferSTL(&this->m_Data);
  BufferSTL::BufferSTL(&this->m_Metadata);
  (this->m_MetadataSet).TimeStep = 1;
  SerialElementIndex::SerialElementIndex(&(this->m_MetadataSet).PGIndex,0,200);
  (this->m_MetadataSet).VarsIndices._M_h._M_buckets =
       &(this->m_MetadataSet).VarsIndices._M_h._M_single_bucket;
  (this->m_MetadataSet).VarsIndices._M_h._M_bucket_count = 1;
  (this->m_MetadataSet).VarsIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_MetadataSet).VarsIndices._M_h._M_element_count = 0;
  (this->m_MetadataSet).VarsIndices._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_MetadataSet).VarsIndices._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_MetadataSet).VarsIndices._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_MetadataSet).AttributesIndices._M_h._M_buckets =
       &(this->m_MetadataSet).AttributesIndices._M_h._M_single_bucket;
  (this->m_MetadataSet).AttributesIndices._M_h._M_bucket_count = 1;
  (this->m_MetadataSet).AttributesIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_MetadataSet).AttributesIndices._M_h._M_element_count = 0;
  (this->m_MetadataSet).AttributesIndices._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_MetadataSet).AttributesIndices._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_MetadataSet).AttributesIndices._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_MetadataSet).MiniFooterSize = 0x38;
  (this->m_MetadataSet).DataPGVarsCountPosition = 0;
  (this->m_MetadataSet).DataPGIsOpen = false;
  (this->m_MetadataSet).MetadataFileLength = 0;
  (this->m_MetadataSet).DataPGCount = 0;
  (this->m_MetadataSet).DataPGLengthPosition = 0;
  (this->m_MetadataSet).DataPGVarsCount = 0;
  (this->m_MetadataSet).StepsStart = 0;
  (this->m_MetadataSet).StepsCount = 0;
  (this->m_MetadataSet).CurrentStep = 0;
  (this->m_Parameters).FlushStepsCount = 1;
  (this->m_Parameters).InitialBufferSize = 0x4000;
  (this->m_Parameters).MaxBufferSize = 0xfffffffffffffffe;
  (this->m_Parameters).StatsBlockSize = 0x4000000000000;
  (this->m_Parameters).GrowthFactor = 1.05;
  (this->m_Parameters).OpenTimeoutSecs = 0.0;
  (this->m_Parameters).BeginStepPollingFrequencySecs = 1.0;
  (this->m_Parameters).StatsLevel = 1;
  (this->m_Parameters).Threads = 1;
  (this->m_Parameters).ProfileUnit = Microseconds;
  (this->m_Parameters).AsyncOpen = true;
  (this->m_Parameters).CollectiveMetadata = true;
  (this->m_Parameters).NodeLocal = false;
  (this->m_Parameters).BeginStepPollingFrequencyIsSet = false;
  (this->m_Parameters).BurstBufferPath._M_dataplus._M_p =
       (pointer)&(this->m_Parameters).BurstBufferPath.field_2;
  (this->m_Parameters).BurstBufferPath._M_string_length = 0;
  (this->m_Parameters).BurstBufferPath.field_2._M_local_buf[0] = '\0';
  (this->m_Parameters).BurstBufferDrain = true;
  (this->m_Parameters).BurstBufferVerbose = 0;
  (this->m_Parameters).StreamReader = false;
  (this->m_Parameters).NumAggregators = 0;
  this->m_IsClosed = false;
  (this->m_Profiler).m_Timers._M_h._M_buckets = &(this->m_Profiler).m_Timers._M_h._M_single_bucket;
  (this->m_Profiler).m_Timers._M_h._M_bucket_count = 1;
  (this->m_Profiler).m_Timers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_Profiler).m_Timers._M_h._M_element_count = 0;
  (this->m_Profiler).m_Timers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Profiler).m_Timers._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_Profiler).m_Timers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_Profiler).m_Bytes._M_h._M_buckets = &(this->m_Profiler).m_Bytes._M_h._M_single_bucket;
  (this->m_Profiler).m_Bytes._M_h._M_bucket_count = 1;
  (this->m_Profiler).m_Bytes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_Profiler).m_Bytes._M_h._M_element_count = 0;
  (this->m_Profiler).m_Bytes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Profiler).m_IsActive = false;
  (this->m_Profiler).m_Bytes._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_Profiler).m_Bytes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_IsRowMajor = true;
  this->m_ReverseDimensions = false;
  aggregator::MPIChain::MPIChain(&this->m_Aggregator);
  p_Var1 = &(this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_DeferredVariablesDataSize = 0;
  (this->m_SerializedAttributes)._M_h._M_buckets =
       &(this->m_SerializedAttributes)._M_h._M_single_bucket;
  (this->m_SerializedAttributes)._M_h._M_bucket_count = 1;
  (this->m_SerializedAttributes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_SerializedAttributes)._M_h._M_element_count = 0;
  (this->m_SerializedAttributes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_SerializedAttributes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_SerializedAttributes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = helper::Comm::Rank(this->m_Comm);
  this->m_RankMPI = iVar2;
  iVar2 = helper::Comm::Size(this->m_Comm);
  this->m_SizeMPI = iVar2;
  (this->m_Profiler).m_IsActive = true;
  return;
}

Assistant:

BPBase::BPBase(helper::Comm const &comm) : m_Comm(comm)
{
    m_RankMPI = m_Comm.Rank();
    m_SizeMPI = m_Comm.Size();
    m_Profiler.m_IsActive = true; // default
}